

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O0

void ising::free_energy::square::transfer_matrix<double>::fill_D
               (uint_t Ly,real_t_conflict Jy,real_t_conflict beta,real_t_conflict h,
               vector<double,_std::allocator<double>_> *diag,
               vector<double,_std::allocator<double>_> *diag_10,
               vector<double,_std::allocator<double>_> *diag_20,
               vector<double,_std::allocator<double>_> *diag_01,
               vector<double,_std::allocator<double>_> *diag_02)

{
  reference pvVar1;
  reference pdVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  ulong in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double dVar4;
  uint_t s_2;
  real_t_conflict factor_1;
  uint_t c_4;
  uint_t s_1;
  uint_t s1_1;
  uint_t s0_1;
  uint_t b_1;
  real_t_conflict factor;
  uint_t c_3;
  uint_t s;
  real_t_conflict elem_1;
  uint_t c_2;
  uint_t s1;
  uint_t s0;
  uint_t b;
  real_t_conflict elem;
  uint_t c_1;
  array<double,_2UL> weight;
  uint_t c;
  uint_t dim;
  size_type in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  ulong local_f0;
  double local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_c0;
  double local_b8;
  ulong local_b0;
  ulong local_a8;
  double local_a0;
  ulong local_98;
  ulong local_80;
  double local_78;
  ulong local_70;
  array<double,_2UL> local_68;
  ulong local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  double local_20;
  double local_18;
  double local_10;
  ulong local_8;
  
  local_50 = (ulong)(1 << ((byte)in_RDI & 0x1f));
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_58);
    *pvVar1 = 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_58);
    *pvVar1 = 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_38,local_58);
    *pvVar1 = 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_40,local_58);
    *pvVar1 = 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_48,local_58);
    *pvVar1 = 1.0;
  }
  dVar3 = exp(local_18 * local_10);
  pdVar2 = boost::array<double,_2UL>::operator[](&local_68,0);
  *pdVar2 = dVar3;
  dVar3 = exp(-local_18 * local_10);
  pdVar2 = boost::array<double,_2UL>::operator[](&local_68,1);
  *pdVar2 = dVar3;
  for (local_70 = 0; local_70 < local_50; local_70 = local_70 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_70);
    local_78 = *pvVar1;
    for (local_80 = 0; local_80 < local_8; local_80 = local_80 + 1) {
      pdVar2 = boost::array<double,_2UL>::operator[]
                         (&local_68,
                          local_70 >> ((byte)local_80 & 0x3f) & 1 ^
                          local_70 >> ((byte)((local_80 + 1) % local_8) & 0x3f) & 1);
      local_78 = *pdVar2 * local_78;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_70);
    *pvVar1 = local_78;
  }
  dVar3 = exp(local_18 * local_20);
  pdVar2 = boost::array<double,_2UL>::operator[](&local_68,0);
  *pdVar2 = dVar3;
  dVar3 = exp(-local_18 * local_20);
  pdVar2 = boost::array<double,_2UL>::operator[](&local_68,1);
  *pdVar2 = dVar3;
  for (local_98 = 0; local_98 < local_50; local_98 = local_98 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_98);
    local_a0 = *pvVar1;
    for (local_a8 = 0; local_a8 < local_8; local_a8 = local_a8 + 1) {
      pdVar2 = boost::array<double,_2UL>::operator[]
                         (&local_68,local_98 >> ((byte)local_a8 & 0x3f) & 1);
      local_a0 = *pdVar2 * local_a0;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_98);
    *pvVar1 = local_a0;
  }
  for (local_b0 = 0; local_b0 < local_50; local_b0 = local_b0 + 1) {
    local_b8 = 0.0;
    for (local_c0 = 0; local_c0 < local_8; local_c0 = local_c0 + 1) {
      dVar4 = (double)((local_b0 >> (local_c0 & 0x3f) & 1) != 0);
      dVar3 = (double)((local_b0 >> ((local_c0 + 1) % local_8 & 0x3f) & 1) != 0);
      local_b8 = local_10 * (1.0 - (dVar4 + dVar4)) * (1.0 - (dVar3 + dVar3)) + local_b8;
    }
    for (local_d8 = 0; local_d8 < local_8; local_d8 = local_d8 + 1) {
      dVar3 = (double)((local_b0 >> (local_d8 & 0x3f) & 1) != 0);
      local_b8 = local_20 * (1.0 - (dVar3 + dVar3)) + local_b8;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_b0);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_b0);
    *pvVar1 = dVar3 * local_b8;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_b0);
    local_b8 = *pvVar1 * local_b8 * local_b8;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_38,local_b0);
    *pvVar1 = local_b8;
  }
  for (local_e0 = 0; local_e0 < local_50; local_e0 = local_e0 + 1) {
    local_e8 = 0.0;
    for (local_f0 = 0; local_f0 < local_8; local_f0 = local_f0 + 1) {
      dVar3 = (double)((local_e0 >> (local_f0 & 0x3f) & 1) != 0);
      local_e8 = local_18 * (1.0 - (dVar3 + dVar3)) + local_e8;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_e0);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_40,local_e0);
    *pvVar1 = dVar3 * local_e8;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_28,local_e0);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_48,local_e0);
    *pvVar1 = dVar3 * local_e8 * local_e8;
  }
  return;
}

Assistant:

static void fill_D(uint_t Ly, real_t Jy, real_t beta, real_t h,
                     std::vector<real_t> &diag, std::vector<real_t> &diag_10,
                     std::vector<real_t> &diag_20, std::vector<real_t> &diag_01,
                     std::vector<real_t> &diag_02) {
    uint_t dim = 1 << Ly;
    diag.resize(dim);
    diag_10.resize(dim);
    diag_20.resize(dim);
    diag_01.resize(dim);
    diag_02.resize(dim);
    for (uint_t c = 0; c < dim; ++c) {
      diag[c] = 1;
      diag_10[c] = 1;
      diag_20[c] = 1;
      diag_01[c] = 1;
      diag_02[c] = 1;
    }
    boost::array<real_t, 2> weight;
    weight[0] = std::exp(beta * Jy);
    weight[1] = std::exp(-beta * Jy);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        elem *= weight[((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      diag[c] = elem;
    }
    weight[0] = std::exp(beta * h);
    weight[1] = std::exp(-beta * h);
    for (uint_t c = 0; c < dim; ++c) {
      real_t elem = diag[c];
      for (uint_t s = 0; s < Ly; ++s) {
        elem *= weight[((c >> s) & 1)];
      }
      diag[c] = elem;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t b = 0; b < Ly; ++b) {
        uint_t s0 = b;
        uint_t s1 = (b + 1) % Ly;
        factor +=
            Jy * (-2.0 * ((c >> s0) & 1) + 1) * (-2.0 * ((c >> s1) & 1) + 1);
      }
      for (uint_t s = 0; s < Ly; ++s) {
        factor += h * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_10[c] = diag[c] * factor;
      diag_20[c] = diag[c] * factor * factor;
    }
    for (uint_t c = 0; c < dim; ++c) {
      real_t factor = 0;
      for (uint_t s = 0; s < Ly; ++s) {
        factor += beta * (-2.0 * ((c >> s) & 1) + 1);
      }
      diag_01[c] = diag[c] * factor;
      diag_02[c] = diag[c] * factor * factor;
    }
  }